

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedBitDecoder.cpp
# Opt level: O1

string * __thiscall
ZXing::OneD::DataBar::DecodeAI013x0x1x_abi_cxx11_
          (string *__return_storage_ptr__,DataBar *this,BitArrayView *bits,char *aiPrefix,
          char *dateCode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint __val;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  string __str;
  string local_58;
  char *local_38;
  
  pcVar4 = aiPrefix;
  DecodeAI01GTIN_abi_cxx11_(__return_storage_ptr__,this,bits);
  iVar3 = (int)pcVar4;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_38 = aiPrefix;
  iVar2 = BitArrayView::peakBits((BitArrayView *)this,0x14);
  *(long *)(this + 8) = *(long *)(this + 8) + 0x14;
  uVar6 = iVar2 / 100000;
  __val = -uVar6;
  if (0 < (int)uVar6) {
    __val = uVar6;
  }
  uVar6 = 1;
  if (((9 < __val) && (uVar6 = 2, 99 < __val)) && (uVar6 = 3, 999 < __val)) {
    uVar6 = 5 - (__val < 10000);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_58,(iVar2 < -99999) + (char)uVar6);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_58._M_dataplus._M_p + (iVar2 < -99999),uVar6,__val);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
  paVar1 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  ToString<int,void>(&local_58,(ZXing *)(ulong)(uint)(iVar2 % 100000),6,iVar3);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  iVar2 = BitArrayView::peakBits((BitArrayView *)this,0x10);
  *(long *)(this + 8) = *(long *)(this + 8) + 0x10;
  if (iVar2 != 0x9600) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    iVar5 = iVar2 + 0x1f;
    if (-1 < iVar2) {
      iVar5 = iVar2;
    }
    ToString<int,void>(&local_58,(ZXing *)(ulong)(uint)(iVar2 / 0x180),2,iVar3);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p)
    ;
    iVar3 = (((uint)((iVar5 >> 5) / 6 + (iVar5 >> 0x1f)) >> 1) - (iVar5 >> 0x1f)) * -0xc;
    iVar5 = (iVar5 >> 5) + iVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    ToString<int,void>(&local_58,(ZXing *)(ulong)(iVar5 + 1),2,iVar3);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    ToString<int,void>(&local_58,(ZXing *)(ulong)(uint)(iVar2 % 0x20),2,iVar3);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string DecodeAI013x0x1x(BitArrayView& bits, const char* aiPrefix, const char* dateCode)
{
	std::string buffer = DecodeAI01GTIN(bits);
	buffer.append(aiPrefix);

	int weight = bits.readBits(20);
	buffer.append(std::to_string(weight / 100000));
	buffer.append(ToString(weight % 100000, 6));

	int date = bits.readBits(16);
	if (date != 38400) {
		buffer.append(dateCode);

		int day = date % 32;
		date /= 32;
		int month = date % 12 + 1;
		date /= 12;
		int year = date;

		buffer.append(ToString(year, 2));
		buffer.append(ToString(month, 2));
		buffer.append(ToString(day, 2));
	}

	return buffer;
}